

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O2

BVHBuildNode * __thiscall
pbrt::BVHAggregate::buildUpperSAH
          (BVHAggregate *this,Allocator alloc,
          vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> *treeletRoots,
          int start,int end,atomic<int> *totalNodes)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  BVHSplitBucket *pBVar3;
  int axis;
  Float FVar4;
  BVHBuildNode *this_00;
  Point3<float> *pPVar5;
  ulong uVar6;
  BVHBuildNode *pBVar7;
  BVHBuildNode *c1;
  Float FVar8;
  long lVar9;
  Bounds3f *pBVar10;
  Bounds3<float> *pBVar11;
  int iVar12;
  int i;
  pointer ppBVar13;
  pointer ppBVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  pointer ppBVar18;
  bool bVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  float fVar25;
  float fVar26;
  undefined1 auVar27 [56];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  Point3<float> PVar30;
  undefined1 local_2a8 [8];
  Bounds3<float> BStack_2a0;
  long local_288;
  Allocator alloc_local;
  int vb_4;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined8 local_258;
  int vb_2;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  int local_22c;
  Bounds3<float> *local_228;
  long local_220;
  Float cost [11];
  Bounds3<float> local_1c0;
  undefined1 local_1a8 [32];
  BVHSplitBucket buckets [12];
  
  uVar20 = (ulong)(uint)start;
  cost[0] = (Float)end;
  alloc_local = alloc;
  buckets[0].count = start;
  if (end <= start) {
    LogFatal<char_const(&)[6],char_const(&)[4],char_const(&)[6],int&,char_const(&)[4],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
               ,0x27c,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [6])"start",
               (char (*) [4])0x539066,(char (*) [6])"start",&buckets[0].count,(char (*) [4])0x539066
               ,(int *)cost);
  }
  if (end - start == 1) {
    this_00 = (treeletRoots->
              super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>).
              _M_impl.super__Vector_impl_data._M_start[start];
  }
  else {
    lVar16 = (long)start;
    LOCK();
    (totalNodes->super___atomic_base<int>)._M_i = (totalNodes->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    this_00 = pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::BVHBuildNode>
                        (&alloc_local);
    auVar21._8_4_ = 0xff7fffff;
    auVar21._0_8_ = 0xff7fffffff7fffff;
    auVar21._12_4_ = 0xff7fffff;
    BStack_2a0.pMax.super_Tuple3<pbrt::Point3,_float>._4_8_ = SEXT48(end);
    local_1a8._0_4_ = 3.4028235e+38;
    local_1a8._4_4_ = 3.4028235e+38;
    local_1a8._8_4_ = 3.4028235e+38;
    local_1a8._12_4_ = -3.4028235e+38;
    local_1a8._16_8_ = vmovlps_avx(auVar21);
    local_288 = lVar16;
    for (; lVar16 < (long)BStack_2a0.pMax.super_Tuple3<pbrt::Point3,_float>._4_8_;
        lVar16 = lVar16 + 1) {
      Union<float>((Bounds3<float> *)buckets,(Bounds3<float> *)local_1a8,
                   &(treeletRoots->
                    super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>)
                    ._M_impl.super__Vector_impl_data._M_start[lVar16]->bounds);
      local_1a8._4_4_ = buckets[0].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
      local_1a8._0_4_ = buckets[0].count;
      local_1a8._8_4_ = buckets[0].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
      local_1a8._12_4_ = buckets[0].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
      local_1a8._16_4_ = buckets[0].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
      local_1a8._20_4_ = buckets[0].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
    }
    auVar28._8_4_ = 0xff7fffff;
    auVar28._0_8_ = 0xff7fffffff7fffff;
    auVar28._12_4_ = 0xff7fffff;
    pBVar11 = (Bounds3<float> *)(local_2a8 + 4);
    local_2a8._0_4_ = 3.4028235e+38;
    local_2a8._4_4_ = 3.4028235e+38;
    BStack_2a0.pMin.super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
    BStack_2a0.pMin.super_Tuple3<pbrt::Point3,_float>.y = -3.4028235e+38;
    BStack_2a0._8_8_ = vmovlps_avx(auVar28);
    for (lVar16 = local_288;
        auVar27 = ZEXT856((ulong)BStack_2a0.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_),
        lVar16 < (long)BStack_2a0.pMax.super_Tuple3<pbrt::Point3,_float>._4_8_; lVar16 = lVar16 + 1)
    {
      pBVar7 = (treeletRoots->
               super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>).
               _M_impl.super__Vector_impl_data._M_start[lVar16];
      PVar30 = Tuple3<pbrt::Point3,float>::operator+
                         ((Tuple3<pbrt::Point3,_float> *)pBVar7,&(pBVar7->bounds).pMax);
      auVar22._0_8_ = PVar30.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar22._8_56_ = auVar27;
      auVar2._8_4_ = 0x3f000000;
      auVar2._0_8_ = 0x3f0000003f000000;
      auVar2._12_4_ = 0x3f000000;
      auVar21 = vmulps_avx512vl(auVar22._0_16_,auVar2);
      cost[2] = PVar30.super_Tuple3<pbrt::Point3,_float>.z * 0.5;
      cost._0_8_ = vmovlps_avx(auVar21);
      Union<float>((Bounds3<float> *)buckets,(Bounds3<float> *)local_2a8,(Point3<float> *)cost);
      local_2a8._4_4_ = buckets[0].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
      local_2a8._0_4_ = buckets[0].count;
      BStack_2a0.pMin.super_Tuple3<pbrt::Point3,_float>.x =
           buckets[0].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
      BStack_2a0.pMin.super_Tuple3<pbrt::Point3,_float>.y =
           buckets[0].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
      BStack_2a0.pMin.super_Tuple3<pbrt::Point3,_float>.z =
           buckets[0].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
      BStack_2a0.pMax.super_Tuple3<pbrt::Point3,_float>.x =
           buckets[0].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
    }
    axis = Bounds3<float>::MaxDimension((Bounds3<float> *)local_2a8);
    if (axis == 1) {
      buckets[0].count = (int)BStack_2a0.pMin.super_Tuple3<pbrt::Point3,_float>.z;
    }
    else if (axis == 0) {
      pBVar11 = (Bounds3<float> *)local_2a8;
      buckets[0].count = (int)BStack_2a0.pMin.super_Tuple3<pbrt::Point3,_float>.y;
    }
    else {
      pBVar11 = &BStack_2a0;
      buckets[0].count = (int)BStack_2a0.pMax.super_Tuple3<pbrt::Point3,_float>.x;
    }
    fVar25 = (pBVar11->pMin).super_Tuple3<pbrt::Point3,_float>.x;
    cost[0] = fVar25;
    if (((float)buckets[0].count == fVar25) && (!NAN((float)buckets[0].count) && !NAN(fVar25))) {
      LogFatal<char_const(&)[25],char_const(&)[25],char_const(&)[25],float&,char_const(&)[25],float&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                 ,0x292,"Check failed: %s != %s with %s = %s, %s = %s",
                 (char (*) [25])"centroidBounds.pMax[dim]",(char (*) [25])"centroidBounds.pMin[dim]"
                 ,(char (*) [25])"centroidBounds.pMax[dim]",(float *)buckets,
                 (char (*) [25])"centroidBounds.pMin[dim]",(float *)cost);
    }
    auVar22 = vpmovsxwd_avx512f(_DAT_0053d960);
    auVar23 = vbroadcastss_avx512f(ZEXT416(0x7f7fffff));
    auVar24 = vbroadcastss_avx512f(ZEXT416(0xff7fffff));
    uVar20 = CONCAT62((int6)(uVar20 >> 0x10),0xfff) & 0xffffffff;
    vpscatterdd_avx512f(ZEXT864(buckets) + auVar22,uVar20,ZEXT464(0) << 0x20);
    vscatterdps_avx512f(ZEXT864(&buckets[0].bounds) + auVar22,uVar20,auVar23);
    vscatterdps_avx512f(ZEXT864(buckets) + _DAT_0053d5c0,uVar20,auVar23);
    vscatterdps_avx512f(ZEXT864(buckets) + _DAT_0053d600,uVar20,auVar23);
    vscatterdps_avx512f(ZEXT864(buckets) + _DAT_0053d640,uVar20,auVar24);
    vscatterdps_avx512f(ZEXT864(buckets) + _DAT_0053d680,uVar20,auVar24);
    vscatterdps_avx512f(ZEXT864(buckets) + _DAT_0053d6c0,uVar20,auVar24);
    for (lVar16 = local_288; lVar16 < (long)BStack_2a0.pMax.super_Tuple3<pbrt::Point3,_float>._4_8_;
        lVar16 = lVar16 + 1) {
      pBVar7 = (treeletRoots->
               super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>).
               _M_impl.super__Vector_impl_data._M_start[lVar16];
      if (axis == 1) {
        pPVar5 = (Point3<float> *)&BStack_2a0.pMin.super_Tuple3<pbrt::Point3,_float>.z;
        fVar25 = ((pBVar7->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y +
                 *(float *)((long)&(pBVar7->bounds).pMax.super_Tuple3<pbrt::Point3,_float> + 4)) *
                 0.5;
        fVar26 = (float)local_2a8._4_4_;
      }
      else if (axis == 0) {
        fVar25 = ((pBVar7->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x +
                 (pBVar7->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x) * 0.5;
        pPVar5 = (Point3<float> *)&BStack_2a0.pMin.super_Tuple3<pbrt::Point3,_float>.y;
        fVar26 = (float)local_2a8._0_4_;
      }
      else {
        fVar25 = ((pBVar7->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z +
                 *(float *)((long)&(pBVar7->bounds).pMax.super_Tuple3<pbrt::Point3,_float> + 8)) *
                 0.5;
        pPVar5 = &BStack_2a0.pMax;
        fVar26 = BStack_2a0.pMin.super_Tuple3<pbrt::Point3,_float>.x;
      }
      FVar8 = (Float)(int)(((fVar25 - fVar26) /
                           ((pPVar5->super_Tuple3<pbrt::Point3,_float>).x - fVar26)) * 12.0);
      FVar4 = 1.54143e-44;
      if (FVar8 != 1.68156e-44) {
        FVar4 = FVar8;
      }
      vb_2 = 0;
      cost[0] = FVar4;
      if ((int)FVar4 < 0) {
        LogFatal<char_const(&)[2],char_const(&)[2],char_const(&)[2],int&,char_const(&)[2],int&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                   ,0x2a5,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [2])0x52b3ac,
                   (char (*) [2])0x53f2eb,(char (*) [2])0x52b3ac,(int *)cost,(char (*) [2])0x53f2eb,
                   &vb_2);
      }
      vb_2 = 0xc;
      if (0xb < (uint)FVar4) {
        LogFatal<char_const(&)[2],char_const(&)[9],char_const(&)[2],int&,char_const(&)[9],int&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                   ,0x2a6,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [2])0x52b3ac,
                   (char (*) [9])"nBuckets",(char (*) [2])0x52b3ac,(int *)cost,
                   (char (*) [9])"nBuckets",&vb_2);
      }
      pBVar10 = &buckets[(uint)FVar4].bounds;
      buckets[(uint)FVar4].count = buckets[(uint)FVar4].count + 1;
      Union<float>((Bounds3<float> *)cost,pBVar10,&pBVar7->bounds);
      buckets[(uint)FVar4].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = cost[4];
      buckets[(uint)FVar4].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = cost[5];
      (pBVar10->pMin).super_Tuple3<pbrt::Point3,_float>.x = cost[0];
      (pBVar10->pMin).super_Tuple3<pbrt::Point3,_float>.y = cost[1];
      *(ulong *)&buckets[(uint)FVar4].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
           CONCAT44(cost[3],cost[2]);
    }
    lVar16 = 1;
    pBVar3 = buckets + 1;
    local_220 = 0xb;
    lVar17 = 0;
    while (local_228 = &pBVar3->bounds, lVar17 != 0xb) {
      auVar29._8_4_ = 0xff7fffff;
      auVar29._0_8_ = 0xff7fffffff7fffff;
      auVar29._12_4_ = 0xff7fffff;
      pBVar3 = buckets;
      iVar12 = 0;
      vb_2 = 0x7f7fffff;
      fStack_244 = 3.4028235e+38;
      fStack_240 = 3.4028235e+38;
      fStack_23c = -3.4028235e+38;
      vb_4 = 0x7f7fffff;
      fStack_264 = 3.4028235e+38;
      fStack_260 = 3.4028235e+38;
      fStack_25c = -3.4028235e+38;
      uVar1 = vmovlps_avx(auVar29);
      local_238 = (float)uVar1;
      fStack_234 = (float)((ulong)uVar1 >> 0x20);
      local_258 = vmovlps_avx(auVar29);
      lVar9 = lVar16;
      while (pBVar10 = &pBVar3->bounds, bVar19 = lVar9 != 0, lVar9 = lVar9 + -1, bVar19) {
        Union<float>(&local_1c0,(Bounds3<float> *)&vb_2,pBVar10);
        iVar12 = iVar12 + *(int *)((long)(pBVar10 + -1) + 0x14);
        pBVar3 = (BVHSplitBucket *)(pBVar10 + 1);
        local_238 = local_1c0.pMax.super_Tuple3<pbrt::Point3,_float>.y;
        fStack_234 = local_1c0.pMax.super_Tuple3<pbrt::Point3,_float>.z;
        vb_2 = local_1c0.pMin.super_Tuple3<pbrt::Point3,_float>.x;
        fStack_244 = local_1c0.pMin.super_Tuple3<pbrt::Point3,_float>.y;
        fStack_240 = local_1c0.pMin.super_Tuple3<pbrt::Point3,_float>.z;
        fStack_23c = local_1c0.pMax.super_Tuple3<pbrt::Point3,_float>.x;
      }
      iVar15 = 0;
      lVar9 = local_220;
      pBVar11 = local_228;
      while (bVar19 = lVar9 != 0, lVar9 = lVar9 + -1, bVar19) {
        Union<float>(&local_1c0,(Bounds3<float> *)&vb_4,pBVar11);
        vb_4 = (int)local_1c0.pMin.super_Tuple3<pbrt::Point3,_float>.x;
        fStack_264 = local_1c0.pMin.super_Tuple3<pbrt::Point3,_float>.y;
        fStack_260 = local_1c0.pMin.super_Tuple3<pbrt::Point3,_float>.z;
        fStack_25c = local_1c0.pMax.super_Tuple3<pbrt::Point3,_float>.x;
        local_258._0_4_ = local_1c0.pMax.super_Tuple3<pbrt::Point3,_float>.y;
        local_258._4_4_ = local_1c0.pMax.super_Tuple3<pbrt::Point3,_float>.z;
        iVar15 = iVar15 + (int)pBVar11[-1].pMax.super_Tuple3<pbrt::Point3,_float>.z;
        pBVar11 = (Bounds3<float> *)&pBVar11[1].pMin.super_Tuple3<pbrt::Point3,_float>.y;
      }
      fVar25 = Bounds3<float>::SurfaceArea((Bounds3<float> *)&vb_2);
      fVar26 = Bounds3<float>::SurfaceArea((Bounds3<float> *)&vb_4);
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * (float)iVar15)),ZEXT416((uint)fVar25),
                                ZEXT416((uint)(float)iVar12));
      fVar25 = Bounds3<float>::SurfaceArea((Bounds3<float> *)local_1a8);
      local_220 = local_220 + -1;
      pBVar3 = (BVHSplitBucket *)&local_228[1].pMin.super_Tuple3<pbrt::Point3,_float>;
      cost[lVar17] = auVar21._0_4_ / fVar25 + 0.125;
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 1;
    }
    uVar6 = 0;
    auVar22 = ZEXT464((uint)cost[0]);
    for (uVar20 = 1; uVar20 != 0xb; uVar20 = uVar20 + 1) {
      fVar25 = auVar22._0_4_;
      auVar21 = vminss_avx(ZEXT416((uint)cost[uVar20]),auVar22._0_16_);
      auVar22 = ZEXT1664(auVar21);
      if (cost[uVar20] < fVar25) {
        uVar6 = uVar20 & 0xffffffff;
      }
    }
    ppBVar18 = (treeletRoots->
               super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    fStack_244 = local_2a8._0_4_;
    fStack_240 = local_2a8._4_4_;
    fStack_23c = BStack_2a0.pMin.super_Tuple3<pbrt::Point3,_float>.x;
    local_238 = BStack_2a0.pMin.super_Tuple3<pbrt::Point3,_float>.y;
    ppBVar13 = ppBVar18 + BStack_2a0.pMax.super_Tuple3<pbrt::Point3,_float>._4_8_;
    fStack_234 = BStack_2a0.pMin.super_Tuple3<pbrt::Point3,_float>.z;
    fStack_230 = BStack_2a0.pMax.super_Tuple3<pbrt::Point3,_float>.x;
    local_22c = (int)uVar6;
    vb_2 = axis;
    for (ppBVar18 = ppBVar18 + local_288; ppBVar14 = ppBVar13, ppBVar18 != ppBVar13;
        ppBVar18 = ppBVar18 + 1) {
      bVar19 = buildUpperSAH::anon_class_32_3_6c4e2daa::operator()
                         ((anon_class_32_3_6c4e2daa *)&vb_2,*ppBVar18);
      if (!bVar19) {
        do {
          ppBVar13 = ppBVar13 + -1;
          ppBVar14 = ppBVar18;
          if (ppBVar13 == ppBVar18) goto LAB_003ffa8a;
          bVar19 = buildUpperSAH::anon_class_32_3_6c4e2daa::operator()
                             ((anon_class_32_3_6c4e2daa *)&vb_2,*ppBVar13);
        } while (!bVar19);
        pBVar7 = *ppBVar18;
        *ppBVar18 = *ppBVar13;
        *ppBVar13 = pBVar7;
      }
    }
LAB_003ffa8a:
    vb_4 = start;
    iVar12 = (int)((ulong)((long)ppBVar14 -
                          (long)(treeletRoots->
                                super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3);
    vb_2 = iVar12;
    if (iVar12 <= start) {
      LogFatal<char_const(&)[4],char_const(&)[6],char_const(&)[4],int&,char_const(&)[6],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                 ,0x2d3,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [4])"mid",
                 (char (*) [6])"start",(char (*) [4])"mid",&vb_2,(char (*) [6])"start",&vb_4);
    }
    vb_4 = end;
    if (end <= iVar12) {
      LogFatal<char_const(&)[4],char_const(&)[4],char_const(&)[4],int&,char_const(&)[4],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                 ,0x2d4,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [4])"mid",
                 (char (*) [4])0x539066,(char (*) [4])"mid",&vb_2,(char (*) [4])0x539066,&vb_4);
    }
    pBVar7 = buildUpperSAH(this,alloc_local,treeletRoots,start,iVar12,totalNodes);
    c1 = buildUpperSAH(this,alloc_local,treeletRoots,iVar12,end,totalNodes);
    BVHBuildNode::InitInterior(this_00,axis,pBVar7,c1);
  }
  return this_00;
}

Assistant:

BVHBuildNode *BVHAggregate::buildUpperSAH(Allocator alloc,
                                          std::vector<BVHBuildNode *> &treeletRoots,
                                          int start, int end,
                                          std::atomic<int> *totalNodes) const {
    CHECK_LT(start, end);
    int nNodes = end - start;
    if (nNodes == 1)
        return treeletRoots[start];
    (*totalNodes)++;
    BVHBuildNode *node = alloc.new_object<BVHBuildNode>();

    // Compute bounds of all nodes under this HLBVH node
    Bounds3f bounds;
    for (int i = start; i < end; ++i)
        bounds = Union(bounds, treeletRoots[i]->bounds);

    // Compute bound of HLBVH node centroids, choose split dimension _dim_
    Bounds3f centroidBounds;
    for (int i = start; i < end; ++i) {
        Point3f centroid =
            (treeletRoots[i]->bounds.pMin + treeletRoots[i]->bounds.pMax) * 0.5f;
        centroidBounds = Union(centroidBounds, centroid);
    }
    int dim = centroidBounds.MaxDimension();
    // FIXME: if this hits, what do we need to do?
    // Make sure the SAH split below does something... ?
    CHECK_NE(centroidBounds.pMax[dim], centroidBounds.pMin[dim]);

    // Allocate _BVHSplitBucket_ for SAH partition buckets
    constexpr int nBuckets = 12;
    struct BVHSplitBucket {
        int count = 0;
        Bounds3f bounds;
    };
    BVHSplitBucket buckets[nBuckets];

    // Initialize _BVHSplitBucket_ for HLBVH SAH partition buckets
    for (int i = start; i < end; ++i) {
        Float centroid =
            (treeletRoots[i]->bounds.pMin[dim] + treeletRoots[i]->bounds.pMax[dim]) *
            0.5f;
        int b = nBuckets * ((centroid - centroidBounds.pMin[dim]) /
                            (centroidBounds.pMax[dim] - centroidBounds.pMin[dim]));
        if (b == nBuckets)
            b = nBuckets - 1;
        CHECK_GE(b, 0);
        CHECK_LT(b, nBuckets);
        buckets[b].count++;
        buckets[b].bounds = Union(buckets[b].bounds, treeletRoots[i]->bounds);
    }

    // Compute costs for splitting after each bucket
    Float cost[nBuckets - 1];
    for (int i = 0; i < nBuckets - 1; ++i) {
        Bounds3f b0, b1;
        int count0 = 0, count1 = 0;
        for (int j = 0; j <= i; ++j) {
            b0 = Union(b0, buckets[j].bounds);
            count0 += buckets[j].count;
        }
        for (int j = i + 1; j < nBuckets; ++j) {
            b1 = Union(b1, buckets[j].bounds);
            count1 += buckets[j].count;
        }
        cost[i] = .125f + (count0 * b0.SurfaceArea() + count1 * b1.SurfaceArea()) /
                              bounds.SurfaceArea();
    }

    // Find bucket to split at that minimizes SAH metric
    Float minCost = cost[0];
    int minCostSplitBucket = 0;
    for (int i = 1; i < nBuckets - 1; ++i) {
        if (cost[i] < minCost) {
            minCost = cost[i];
            minCostSplitBucket = i;
        }
    }

    // Split nodes and create interior HLBVH SAH node
    BVHBuildNode **pmid = std::partition(
        &treeletRoots[start], &treeletRoots[end - 1] + 1, [=](const BVHBuildNode *node) {
            Float centroid = (node->bounds.pMin[dim] + node->bounds.pMax[dim]) * 0.5f;
            int b = nBuckets * ((centroid - centroidBounds.pMin[dim]) /
                                (centroidBounds.pMax[dim] - centroidBounds.pMin[dim]));
            if (b == nBuckets)
                b = nBuckets - 1;
            CHECK_GE(b, 0);
            CHECK_LT(b, nBuckets);
            return b <= minCostSplitBucket;
        });
    int mid = pmid - &treeletRoots[0];
    CHECK_GT(mid, start);
    CHECK_LT(mid, end);
    node->InitInterior(dim,
                       this->buildUpperSAH(alloc, treeletRoots, start, mid, totalNodes),
                       this->buildUpperSAH(alloc, treeletRoots, mid, end, totalNodes));
    return node;
}